

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall
SpikesConsumer::SpikesConsumer
          (SpikesConsumer *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs,int np
          )

{
  size_t sVar1;
  byte *pbVar2;
  ulong uVar3;
  HighFreqDataType HStack_b8;
  
  HighFreqDataType::HighFreqDataType(&HStack_b8,hf);
  HFSubConsumer::HFSubConsumer
            (&this->super_HFSubConsumer,&HStack_b8,(long)ringbufsize,default_consumer_queue_filter);
  HighFreqDataType::~HighFreqDataType(&HStack_b8);
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__SpikesConsumer_0043aa30;
  HFParsingInfo::HFParsingInfo(&this->args,parseargs);
  this->maxpoints = np;
  (this->super_HFSubConsumer).super_HighFreqSub.sockType = ST_FILTERED_CONSUMER;
  sVar1 = spikePacket::headersize();
  uVar3 = sVar1 + (long)this->maxpoints * 4 + 4;
  this->tempbufsize = uVar3;
  pbVar2 = (byte *)operator_new__(uVar3);
  this->tempbuffer = pbVar2;
  return;
}

Assistant:

SpikesConsumer::SpikesConsumer(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs, int np)
    : HFSubConsumer(hf, ringbufsize),
      args(parseargs),
      maxpoints(np)
{
    sockType = ST_FILTERED_CONSUMER;
    //buffer to hold max possible size of spikes packet
    //ntrodeid + cluster + timestamp + waveformlength (in int2d's) + waveform memory
    tempbufsize = spikePacket::headersize() + sizeof(int) + sizeof(int2d)*maxpoints;
    tempbuffer = new byte[tempbufsize];
}